

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O3

void test_regex(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *extraout_RAX;
  char *extraout_RAX_00;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  undefined8 extraout_RAX_01;
  int extraout_var;
  long extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  undefined8 extraout_RAX_05;
  undefined8 extraout_RAX_06;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  char *extraout_RAX_07;
  dirent *pdVar15;
  size_t sVar16;
  size_t sVar17;
  DIR *__dirp;
  FILE *__stream;
  long lVar18;
  char *pcVar19;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  ulong uVar20;
  char *pcVar21;
  DIR *__s;
  DIR *__name;
  char *pcVar22;
  DIR *paths;
  DIR *__filename;
  undefined1 *puVar23;
  char *pcVar24;
  char *pcVar25;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  char *flags;
  char *regex;
  undefined1 auStack_7588 [8];
  undefined1 auStack_7580 [504];
  ulong uStack_7388;
  DIR *pDStack_7380;
  dirent *pdStack_7378;
  DIR *pDStack_7370;
  DIR *pDStack_7368;
  stat sStack_7360;
  char acStack_72d0 [512];
  size_t sStack_70d0;
  dirent *pdStack_70c8;
  DIR *pDStack_70c0;
  char *pcStack_70b8;
  code *pcStack_70b0;
  char *pcStack_70a8;
  ulong uStack_70a0;
  char *pcStack_7098;
  DIR *pDStack_7090;
  code *pcStack_7088;
  undefined8 uStack_7050;
  undefined1 *puStack_7048;
  undefined1 *puStack_7040;
  undefined1 auStack_7030 [8];
  char *pcStack_7028;
  char *pcStack_7018;
  char *pcStack_7010;
  undefined8 uStack_7008;
  undefined8 uStack_6ff0;
  DIR aDStack_6f80 [25944];
  char *pcStack_a28;
  char *pcStack_a20;
  char *pcStack_a18;
  char *pcStack_a10;
  code *apcStack_a08 [2];
  undefined1 auStack_9f8 [116];
  uint uStack_984;
  char acStack_980 [256];
  undefined8 uStack_880;
  char *pcStack_878;
  char *pcStack_870;
  char *pcStack_868;
  char *pcStack_860;
  char *pcStack_858;
  char *pcStack_850;
  undefined8 uStack_848;
  code *pcStack_840;
  char *pcStack_838;
  undefined8 uStack_830;
  char *pcStack_828;
  char *pcStack_820;
  char *pcStack_818;
  char *pcStack_810;
  code *pcStack_808;
  undefined8 uStack_800;
  undefined8 uStack_7f8;
  char *pcStack_7f0;
  char *pcStack_7e8;
  char *pcStack_7e0;
  undefined8 uStack_7d8;
  bson_t *pbStack_7d0;
  char *pcStack_7c8;
  code *pcStack_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  char *pcStack_7a0;
  char *pcStack_798;
  char *pcStack_790;
  char *pcStack_788;
  char *pcStack_780;
  code *pcStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined1 *puStack_758;
  char *pcStack_750;
  char *pcStack_748;
  code *pcStack_740;
  undefined8 uStack_738;
  ulong uStack_730;
  ulong uStack_728;
  undefined1 *puStack_720;
  char *pcStack_718;
  void *pvStack_710;
  code *pcStack_708;
  uint uStack_684;
  undefined1 auStack_680 [4];
  uint uStack_67c;
  ulong uStack_530;
  ulong uStack_528;
  undefined1 *puStack_520;
  char *pcStack_518;
  void *pvStack_510;
  code *apcStack_508 [16];
  uint uStack_484;
  undefined1 auStack_480 [4];
  uint uStack_47c;
  undefined8 uStack_338;
  ulong uStack_330;
  undefined1 *puStack_328;
  char *pcStack_320;
  undefined8 uStack_318;
  code *apcStack_310 [2];
  undefined8 uStack_300;
  code *pcStack_2f8;
  undefined8 uStack_2e8;
  code *pcStack_2e0;
  long lStack_2d8;
  undefined8 uStack_2d0;
  code *pcStack_2c8;
  undefined8 uStack_2c0;
  int iStack_2b8;
  int iStack_2b4;
  undefined8 uStack_2b0;
  char *pcStack_2a8;
  code *pcStack_2a0;
  int iStack_294;
  ulong uStack_290;
  code *pcStack_288;
  undefined8 uStack_280;
  uint uStack_20c;
  char *pcStack_208;
  undefined1 auStack_200 [4];
  uint uStack_1fc;
  undefined8 uStack_e0;
  char *pcStack_b0;
  undefined8 uStack_a8;
  code *pcStack_a0;
  char *pcStack_98;
  undefined8 uStack_90;
  code *pcStack_88;
  undefined8 uStack_80;
  undefined8 uStack_70;
  char *pcStack_68;
  undefined1 auStack_5c [12];
  undefined8 uStack_50;
  char *pcStack_48;
  code *pcStack_40;
  undefined8 local_38;
  char *local_28;
  char *local_20;
  
  pcStack_40 = (code *)0x13cb3a;
  uVar6 = bson_bcon_magic();
  local_38 = 0;
  pcStack_40 = (code *)0x13cb6a;
  uVar6 = bcon_new(0,"foo",uVar6,10,"^foo|bar$","i");
  pcStack_40 = (code *)0x13cb72;
  uVar7 = bson_bcone_magic();
  local_38 = 0;
  pcStack_40 = (code *)0x13cb95;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,10,&local_20,&local_28);
  if (cVar1 == '\0') {
    pcStack_40 = (code *)0x13cbd5;
    test_regex_cold_1();
LAB_0013cbd5:
    pcStack_40 = (code *)0x13cbda;
    test_regex_cold_2();
  }
  else {
    pcStack_40 = (code *)0x13cbaa;
    iVar2 = strcmp(local_20,"^foo|bar$");
    if (iVar2 != 0) goto LAB_0013cbd5;
    if ((*local_28 == 'i') && (local_28[1] == '\0')) {
      pcStack_40 = (code *)0x13cbc6;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_40 = test_dbpointer;
  test_regex_cold_3();
  pcStack_40 = (code *)0x0;
  pcStack_48 = "foo";
  pcStack_88 = (code *)0x13cbfa;
  uStack_50 = uVar6;
  bson_oid_init(auStack_5c,0);
  pcStack_88 = (code *)0x13cbff;
  uVar6 = bson_bcon_magic();
  uStack_80 = 0;
  pcStack_88 = (code *)0x13cc28;
  uVar6 = bcon_new(0,"foo",uVar6,0xb,"collection",auStack_5c);
  pcStack_88 = (code *)0x13cc30;
  uVar7 = bson_bcone_magic();
  uStack_80 = 0;
  pcStack_88 = (code *)0x13cc53;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xb,&pcStack_68,&uStack_70);
  if (cVar1 == '\0') {
    pcStack_88 = (code *)0x13cc96;
    test_dbpointer_cold_1();
LAB_0013cc96:
    pcStack_88 = (code *)0x13cc9b;
    test_dbpointer_cold_2();
  }
  else {
    pcStack_88 = (code *)0x13cc68;
    iVar2 = strcmp(pcStack_68,"collection");
    if (iVar2 != 0) goto LAB_0013cc96;
    pcStack_88 = (code *)0x13cc7b;
    cVar1 = bson_oid_equal(uStack_70,auStack_5c);
    if (cVar1 != '\0') {
      pcStack_88 = (code *)0x13cc87;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_88 = test_code;
  test_dbpointer_cold_3();
  pcStack_88 = (code *)0x1403a7;
  pcStack_a0 = (code *)0x13cca9;
  pcStack_98 = extraout_RAX;
  uStack_90 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_a0 = (code *)0x13ccce;
  uVar6 = bcon_new(0,"foo",uVar6,0xc,"var a = {};",0);
  pcStack_a0 = (code *)0x13ccd6;
  uVar7 = bson_bcone_magic();
  pcStack_a0 = (code *)0x13ccf1;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xc,&pcStack_98,0);
  if (cVar1 == '\0') {
    pcStack_a0 = (code *)0x13cd1e;
    test_code_cold_1();
  }
  else {
    pcStack_a0 = (code *)0x13cd05;
    iVar2 = strcmp(pcStack_98,"var a = {};");
    if (iVar2 == 0) {
      pcStack_a0 = (code *)0x13cd11;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_a0 = test_symbol;
  test_code_cold_2();
  pcStack_a0 = (code *)0x1403a7;
  pcStack_b0 = extraout_RAX_00;
  uStack_a8 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0xd,"symbol",0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xd,&pcStack_b0,0);
  if (cVar1 == '\0') {
    test_symbol_cold_1();
  }
  else {
    iVar2 = strcmp(pcStack_b0,"symbol");
    if (iVar2 == 0) {
      bson_destroy(uVar6);
      return;
    }
  }
  test_symbol_cold_2();
  pcStack_288 = (code *)0x13cdc3;
  uStack_e0 = uVar6;
  pvVar8 = (void *)bson_bcon_magic();
  puVar23 = (undefined1 *)0x0;
  pcStack_288 = (code *)0x13cdea;
  uVar9 = bcon_new(0,"b",pvVar8,0xf,10,0);
  uStack_280 = 0;
  pcVar25 = "foo";
  pcStack_288 = (code *)0x13ce16;
  uVar10 = bcon_new(0,"foo",pvVar8,0xe,"var a = b;",uVar9);
  pcStack_288 = (code *)0x13ce1e;
  uVar6 = bson_bcone_magic();
  uStack_280 = 0;
  pcStack_288 = (code *)0x13ce44;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,0xe,&pcStack_208,auStack_200);
  if (cVar1 == '\0') {
    pcStack_288 = (code *)0x13cfdd;
    test_codewscope_cold_1();
LAB_0013cfdd:
    pcStack_288 = (code *)0x13cfe2;
    test_codewscope_cold_2();
  }
  else {
    pcStack_288 = (code *)0x13ce5d;
    iVar2 = strcmp(pcStack_208,"var a = b;");
    if (iVar2 != 0) goto LAB_0013cfdd;
    pcStack_288 = (code *)0x13ce75;
    pcVar25 = (char *)bson_get_data(auStack_200);
    pcStack_288 = (code *)0x13ce80;
    pvVar8 = (void *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_1fc) {
      pcStack_288 = (code *)0x13ce94;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_288 = (code *)0x13cea4;
      pvVar12 = (void *)bson_get_data(auStack_200);
      pcStack_288 = (code *)0x13ceb2;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_288 = (code *)0x13cec3;
        bson_destroy(auStack_200);
        pcStack_288 = (code *)0x13cecb;
        bson_destroy(uVar9);
        pcStack_288 = (code *)0x13ced3;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_200;
    pcStack_288 = (code *)0x13cef4;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    pcStack_288 = (code *)0x13cf01;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_1fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (pcVar25[uVar20] != *(char *)((long)pvVar8 + uVar20)) goto LAB_0013cfd1;
        uVar20 = uVar20 + 1;
      } while (uStack_1fc != (uint)uVar20);
    }
    uVar4 = uStack_1fc;
    if (uStack_1fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_288 = (code *)0x13cf4d;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      pcStack_288 = (code *)0x13cf65;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      pcStack_288 = (code *)0x13cf80;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_20c = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013cfe7;
      uVar10 = (ulong)uStack_1fc;
      pcStack_288 = (code *)0x13cfaa;
      uVar20 = write(uVar3,pcVar25,uVar10);
      if (uVar20 != uVar10) goto LAB_0013cfec;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      pcStack_288 = (code *)0x13cfc0;
      uVar20 = write(uVar4,pvVar8,uVar9);
      if (uVar20 != uVar9) goto LAB_0013cff1;
      uVar20 = (ulong)uVar4;
      pcStack_288 = (code *)0x13cfd1;
      test_codewscope_cold_5();
      uVar6 = extraout_RAX_01;
LAB_0013cfd1:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_288 = (code *)0x13cfe7;
  test_codewscope_cold_7();
LAB_0013cfe7:
  pcStack_288 = (code *)0x13cfec;
  test_codewscope_cold_6();
LAB_0013cfec:
  pcStack_288 = (code *)0x13cff1;
  test_codewscope_cold_3();
LAB_0013cff1:
  pcStack_288 = test_int32;
  test_codewscope_cold_4();
  pcStack_2a0 = (code *)0x13cfff;
  uStack_290 = uVar9;
  pcStack_288 = (code *)pvVar8;
  iStack_294 = extraout_var;
  uVar6 = bson_bcon_magic();
  pcStack_2a0 = (code *)0x13d023;
  uVar6 = bcon_new(0,"foo",uVar6,0xf,10,0);
  pcStack_2a0 = (code *)0x13d02b;
  uVar7 = bson_bcone_magic();
  pcStack_2a0 = (code *)0x13d048;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xf,&iStack_294,0);
  if (cVar1 == '\0') {
    pcStack_2a0 = (code *)0x13d068;
    test_int32_cold_1();
  }
  else if (iStack_294 == 10) {
    pcStack_2a0 = (code *)0x13d05b;
    bson_destroy(uVar6);
    return;
  }
  pcStack_2a0 = test_timestamp;
  test_int32_cold_2();
  pcStack_2a8 = "foo";
  pcStack_2c8 = (code *)0x13d07b;
  uStack_2b0 = uVar6;
  pcStack_2a0 = (code *)pcVar25;
  uVar6 = bson_bcon_magic();
  pvVar8 = (void *)0x0;
  uStack_2c0 = 0;
  pcStack_2c8 = (code *)0x13d0a9;
  uVar6 = bcon_new(0,"foo",uVar6,0x10,100,1000);
  pcStack_2c8 = (code *)0x13d0b1;
  uVar7 = bson_bcone_magic();
  uStack_2c0 = 0;
  pcStack_2c8 = (code *)0x13d0d4;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x10,&iStack_2b4,&iStack_2b8);
  if (cVar1 == '\0') {
    pcStack_2c8 = (code *)0x13d100;
    test_timestamp_cold_1();
LAB_0013d100:
    pcStack_2c8 = (code *)0x13d105;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_2b4 != 100) goto LAB_0013d100;
    if (iStack_2b8 == 1000) {
      pcStack_2c8 = (code *)0x13d0f1;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_2c8 = test_int64;
  test_timestamp_cold_3();
  pcStack_2c8 = (code *)0x1403a7;
  pcStack_2e0 = (code *)0x13d113;
  lStack_2d8 = extraout_RAX_02;
  uStack_2d0 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_2e0 = (code *)0x13d137;
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  pcStack_2e0 = (code *)0x13d13f;
  uVar7 = bson_bcone_magic();
  pcStack_2e0 = (code *)0x13d15a;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&lStack_2d8,0);
  if (cVar1 == '\0') {
    pcStack_2e0 = (code *)0x13d17a;
    test_int64_cold_1();
  }
  else if (lStack_2d8 == 10) {
    pcStack_2e0 = (code *)0x13d16d;
    bson_destroy(uVar6);
    return;
  }
  pcStack_2e0 = test_maxkey;
  test_int64_cold_2();
  pcStack_2e0 = (code *)0x1403a7;
  pcStack_2f8 = (code *)0x13d188;
  uStack_2e8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_2f8 = (code *)0x13d1a6;
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  pcStack_2f8 = (code *)0x13d1ae;
  uVar7 = bson_bcone_magic();
  pcStack_2f8 = (code *)0x13d1c6;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_2f8 = test_minkey;
  test_maxkey_cold_1();
  pcStack_2f8 = (code *)0x1403a7;
  apcStack_310[0] = (code *)0x13d1e7;
  uStack_300 = uVar6;
  uVar6 = bson_bcon_magic();
  apcStack_310[0] = (code *)0x13d205;
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  apcStack_310[0] = (code *)0x13d20d;
  uVar7 = bson_bcone_magic();
  apcStack_310[0] = (code *)0x13d225;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  apcStack_310[0] = test_bson_document;
  test_minkey_cold_1();
  uStack_318 = 0;
  pcStack_320 = "foo";
  apcStack_508[0] = (code *)0x13d26e;
  uStack_338 = uVar6;
  uStack_330 = uVar10;
  puStack_328 = puVar23;
  apcStack_310[0] = (code *)&stack0xffffffffffffff48;
  uVar9 = bcon_new(0,"bar","baz",0);
  apcStack_508[0] = (code *)0x13d276;
  uVar6 = bson_bcon_magic();
  pcVar25 = "foo";
  apcStack_508[0] = (code *)0x13d297;
  uVar10 = bcon_new(0,"foo",uVar6,2,uVar9,0);
  apcStack_508[0] = (code *)0x13d29f;
  uVar6 = bson_bcone_magic();
  apcStack_508[0] = (code *)0x13d2bf;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,2,auStack_480,0);
  if (cVar1 == '\0') {
    apcStack_508[0] = (code *)0x13d43f;
    test_bson_document_cold_1();
  }
  else {
    apcStack_508[0] = (code *)0x13d2d7;
    pvVar8 = (void *)bson_get_data(auStack_480);
    apcStack_508[0] = (code *)0x13d2e2;
    pcVar25 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_47c) {
      apcStack_508[0] = (code *)0x13d2f6;
      pvVar11 = (void *)bson_get_data(uVar9);
      apcStack_508[0] = (code *)0x13d306;
      pvVar12 = (void *)bson_get_data(auStack_480);
      apcStack_508[0] = (code *)0x13d314;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        apcStack_508[0] = (code *)0x13d325;
        bson_destroy(auStack_480);
        apcStack_508[0] = (code *)0x13d32d;
        bson_destroy(uVar9);
        apcStack_508[0] = (code *)0x13d335;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_480;
    apcStack_508[0] = (code *)0x13d356;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    apcStack_508[0] = (code *)0x13d363;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_47c != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar8 + uVar20) != pcVar25[uVar20]) goto LAB_0013d433;
        uVar20 = uVar20 + 1;
      } while (uStack_47c != (uint)uVar20);
    }
    uVar4 = uStack_47c;
    if (uStack_47c < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_508[0] = (code *)0x13d3af;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      apcStack_508[0] = (code *)0x13d3c7;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      apcStack_508[0] = (code *)0x13d3e2;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_484 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d444;
      uVar10 = (ulong)uStack_47c;
      apcStack_508[0] = (code *)0x13d40c;
      uVar20 = write(uVar3,pvVar8,uVar10);
      if (uVar20 != uVar10) goto LAB_0013d449;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      apcStack_508[0] = (code *)0x13d422;
      uVar20 = write(uVar4,pcVar25,uVar9);
      if (uVar20 != uVar9) goto LAB_0013d44e;
      uVar20 = (ulong)uVar4;
      apcStack_508[0] = (code *)0x13d433;
      test_bson_document_cold_4();
      uVar6 = extraout_RAX_03;
LAB_0013d433:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  apcStack_508[0] = (code *)0x13d444;
  test_bson_document_cold_6();
LAB_0013d444:
  apcStack_508[0] = (code *)0x13d449;
  test_bson_document_cold_5();
LAB_0013d449:
  apcStack_508[0] = (code *)0x13d44e;
  test_bson_document_cold_2();
LAB_0013d44e:
  apcStack_508[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_708 = (code *)0x13d484;
  uStack_530 = uVar9;
  uStack_528 = uVar10;
  puStack_520 = puVar23;
  pcStack_518 = pcVar25;
  pvStack_510 = pvVar8;
  apcStack_508[0] = (code *)apcStack_310;
  uVar9 = bcon_new(0,"0","baz",0);
  pcStack_708 = (code *)0x13d48c;
  uVar6 = bson_bcon_magic();
  pcVar25 = "foo";
  pcStack_708 = (code *)0x13d4ad;
  uVar10 = bcon_new(0,"foo",uVar6,3,uVar9,0);
  pcStack_708 = (code *)0x13d4b5;
  uVar6 = bson_bcone_magic();
  pcStack_708 = (code *)0x13d4d5;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,3,auStack_680,0);
  if (cVar1 == '\0') {
    pcStack_708 = (code *)0x13d655;
    test_bson_array_cold_1();
  }
  else {
    pcStack_708 = (code *)0x13d4ed;
    pvVar8 = (void *)bson_get_data(auStack_680);
    pcStack_708 = (code *)0x13d4f8;
    pcVar25 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_67c) {
      pcStack_708 = (code *)0x13d50c;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_708 = (code *)0x13d51c;
      pvVar12 = (void *)bson_get_data(auStack_680);
      pcStack_708 = (code *)0x13d52a;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_708 = (code *)0x13d53b;
        bson_destroy(auStack_680);
        pcStack_708 = (code *)0x13d543;
        bson_destroy(uVar9);
        pcStack_708 = (code *)0x13d54b;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_680;
    pcStack_708 = (code *)0x13d56c;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    pcStack_708 = (code *)0x13d579;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_67c != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar8 + uVar20) != pcVar25[uVar20]) goto LAB_0013d649;
        uVar20 = uVar20 + 1;
      } while (uStack_67c != (uint)uVar20);
    }
    uVar4 = uStack_67c;
    if (uStack_67c < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_708 = (code *)0x13d5c5;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      pcStack_708 = (code *)0x13d5dd;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      pcStack_708 = (code *)0x13d5f8;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_684 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d65a;
      uVar10 = (ulong)uStack_67c;
      pcStack_708 = (code *)0x13d622;
      uVar20 = write(uVar3,pvVar8,uVar10);
      if (uVar20 != uVar10) goto LAB_0013d65f;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      pcStack_708 = (code *)0x13d638;
      uVar20 = write(uVar4,pcVar25,uVar9);
      if (uVar20 != uVar9) goto LAB_0013d664;
      uVar20 = (ulong)uVar4;
      pcStack_708 = (code *)0x13d649;
      test_bson_array_cold_4();
      uVar6 = extraout_RAX_04;
LAB_0013d649:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_708 = (code *)0x13d65a;
  test_bson_array_cold_6();
LAB_0013d65a:
  pcStack_708 = (code *)0x13d65f;
  test_bson_array_cold_5();
LAB_0013d65f:
  pcStack_708 = (code *)0x13d664;
  test_bson_array_cold_2();
LAB_0013d664:
  pcStack_708 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_740 = (code *)0x13d679;
  uStack_738 = extraout_RAX_05;
  uStack_730 = uVar9;
  uStack_728 = uVar10;
  puStack_720 = puVar23;
  pcStack_718 = pcVar25;
  pvStack_710 = pvVar8;
  pcStack_708 = (code *)apcStack_508;
  uStack_768 = bson_bcon_magic();
  pcStack_748 = (char *)0x0;
  pcStack_750 = "]";
  puStack_758 = (undefined1 *)0x2;
  uStack_760 = 0xf;
  uStack_770 = 0x13d6c1;
  uVar6 = bcon_new(0,"foo","[",uStack_768,0xf,1);
  pcStack_740 = (code *)0x13d6cd;
  uStack_768 = bson_bcone_magic();
  pcStack_748 = (char *)0x0;
  pcStack_750 = "]";
  uStack_760 = 0xf;
  uStack_770 = 0x13d6fc;
  puStack_758 = (undefined1 *)&uStack_738;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_768,0xf,(long)&uStack_738 + 4);
  if (cVar1 == '\0') {
    pcStack_740 = (code *)0x13d72d;
    test_inline_array_cold_1();
LAB_0013d72d:
    pcStack_740 = (code *)0x13d732;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_738._4_4_ != 1) goto LAB_0013d72d;
    if ((int)uStack_738 == 2) {
      pcStack_740 = (code *)0x13d719;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_740 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_740 = (code *)0x14a05b;
  pcStack_748 = "[";
  pcStack_750 = "foo";
  puStack_758 = (undefined1 *)0x0;
  uStack_760 = 0xf;
  pcStack_778 = (code *)0x13d747;
  uStack_770 = extraout_RAX_06;
  uStack_768 = uVar6;
  pcStack_7a0 = (char *)bson_bcon_magic();
  pcStack_780 = (char *)0x0;
  pcStack_788 = "}";
  pcStack_790 = (char *)0x1;
  pcStack_798 = (char *)0xf;
  uStack_7a8 = "a";
  uStack_7b0 = 2;
  uStack_7b8 = 0x13d79a;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_7a0,0xf);
  pcStack_778 = (code *)0x13d7a6;
  pcStack_7a0 = (char *)bson_bcone_magic();
  uStack_7b0 = (long)&uStack_770 + 4;
  pcStack_780 = (char *)0x0;
  pcStack_788 = "}";
  pcStack_798 = (char *)0xf;
  uStack_7a8 = "b";
  uStack_7b8 = 0x13d7e9;
  pcStack_790 = (char *)&uStack_770;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_7a0,0xf);
  if (cVar1 == '\0') {
    pcStack_778 = (code *)0x13d81a;
    test_inline_doc_cold_1();
LAB_0013d81a:
    pcStack_778 = (code *)0x13d81f;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_770._4_4_ != 1) goto LAB_0013d81a;
    if ((int)uStack_770 == 2) {
      pcStack_778 = (code *)0x13d806;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_778 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_778 = (code *)0x0;
  pcStack_780 = "a";
  pcStack_790 = "{";
  pcStack_798 = "foo";
  pcStack_7a0 = "}";
  pcStack_7c0 = (code *)0x13d837;
  pcStack_788 = (char *)uVar6;
  uStack_7f8 = (undefined8 *)bson_bcon_magic();
  pcStack_7c0 = (code *)0x0;
  pcStack_7c8 = (char *)0x3;
  pbStack_7d0 = (bson_t *)0xf;
  pcStack_7e0 = "c";
  pcStack_7e8 = (char *)0x2;
  pcStack_7f0 = (char *)0xf;
  uStack_800 = 0x13d879;
  uStack_7d8 = uStack_7f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_7f8,0xf,1,"b");
  pcStack_7c0 = (code *)0x13d885;
  pcStack_808 = (code *)bson_bcone_magic();
  pbStack_7d0 = (bson_t *)((long)&uStack_7b0 + 4);
  uStack_7f8 = &uStack_7a8;
  pcStack_7c8 = (char *)0x0;
  uStack_7d8 = 0xf;
  pcStack_7e8 = "c";
  pcStack_7f0 = (char *)0x0;
  uStack_800 = 0xf;
  pcStack_810 = "b";
  pcStack_818 = (char *)0x0;
  pcStack_820 = (char *)0x13d8d1;
  pcStack_7e0 = (char *)pcStack_808;
  test_extract_ctx_helper(bson,3,"a",pcStack_808,0xf,(long)&uStack_7a8 + 4);
  if (uStack_7a8._4_4_ == 1) {
    if ((int)uStack_7a8 != 2) goto LAB_0013d906;
    if (uStack_7b0._4_4_ == 3) {
      pcStack_7c0 = (code *)0x13d8f2;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_7c0 = (code *)0x13d906;
    test_extract_ctx_cold_1();
LAB_0013d906:
    pcStack_7c0 = (code *)0x13d90b;
    test_extract_ctx_cold_2();
  }
  pcStack_7c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_7c0 = (code *)0xf;
  pcStack_7c8 = "a";
  uStack_7d8 = 0;
  pcStack_7e8 = "c";
  pcStack_808 = (code *)0x13d923;
  pcStack_7e0 = (char *)((long)&uStack_7a8 + 4);
  pbStack_7d0 = bson;
  uStack_830 = bson_bcon_magic();
  pcStack_810 = (char *)0x0;
  pcStack_818 = "}";
  pcStack_820 = (char *)0xa;
  pcStack_828 = (char *)0xf;
  pcStack_838 = (char *)0x13d978;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_808 = (code *)0x13d984;
  uStack_830 = bson_bcone_magic();
  pcStack_820 = (char *)((long)&uStack_7f8 + 4);
  pcStack_810 = (char *)0x0;
  pcStack_818 = "}";
  pcStack_828 = (char *)0xf;
  pcStack_838 = "bar";
  pcStack_840 = (code *)0x141970;
  uStack_848 = 0x13d9c0;
  cVar1 = bcon_extract(uVar6,"hello",uStack_830,0,&pcStack_7f0,"foo");
  if (cVar1 == '\0') {
    pcStack_808 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_808 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_808 = (code *)0x13d9d9;
    iVar2 = strcmp("world",pcStack_7f0);
    if (iVar2 != 0) goto LAB_0013da00;
    if (uStack_7f8._4_4_ == 10) {
      pcStack_808 = (code *)0x13d9ec;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_808 = test_skip;
  test_nested_cold_3();
  pcStack_808 = (code *)0x14ad57;
  pcStack_810 = "bar";
  pcStack_818 = (char *)0x0;
  pcStack_820 = "hello";
  pcStack_828 = "foo";
  pcStack_840 = (code *)0x13da1a;
  uStack_830 = uVar6;
  pcStack_868 = (char *)bson_bcon_magic();
  uStack_848 = 0;
  pcStack_850 = "}";
  pcStack_858 = (char *)0xa;
  pcStack_860 = (char *)0xf;
  pcStack_870 = (char *)0x13da6d;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_840 = (code *)0x13da79;
  pcVar25 = (char *)bson_bcone_magic();
  pcVar24 = "}";
  uStack_848 = 0;
  pcStack_850 = "}";
  pcStack_858 = (char *)0x10;
  pcStack_860 = (char *)0x1c;
  pcStack_870 = "bar";
  pcStack_878 = "{";
  uStack_880 = 0x13dab5;
  pcStack_868 = pcVar25;
  cVar1 = bcon_extract(uVar6,"hello",pcVar25,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_840 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_848 = 0;
    pcStack_850 = "}";
    pcStack_858 = (char *)0x12;
    pcStack_860 = (char *)0x1c;
    pcStack_870 = "bar";
    pcStack_878 = "{";
    uStack_880 = 0x13daf4;
    pcStack_868 = pcVar25;
    cVar1 = bcon_extract(uVar6,"hello",pcVar25,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_840 = test_iter;
  test_skip_cold_2();
  pcStack_840 = (code *)0x14e902;
  pcStack_850 = "bar";
  pcStack_858 = "}";
  pcStack_868 = "{";
  apcStack_a08[0] = (code *)0x13db39;
  pcStack_860 = pcVar25;
  uStack_848 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_a08[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_a08[0] = (code *)0x13db68;
  uVar6 = bson_bcone_magic();
  pcVar13 = acStack_980;
  pcVar21 = "foo";
  pcVar19 = (char *)0x1d;
  uVar7 = 0;
  apcStack_a08[0] = (code *)0x13db88;
  pcVar22 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  if (cVar1 == '\0') {
    apcStack_a08[0] = (code *)0x13dd34;
    uVar6 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_a08[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar22 = acStack_980;
    apcStack_a08[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar22 = acStack_980;
    apcStack_a08[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar7 = 0;
      apcStack_a08[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_980);
      apcStack_a08[0] = (code *)0x13dbea;
      pcVar25 = (char *)bson_get_data(__n_00);
      apcStack_a08[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_a08[0] = (code *)0x13dc09;
        pvVar8 = (void *)bson_get_data(__n);
        apcStack_a08[0] = (code *)0x13dc14;
        pvVar11 = (void *)bson_get_data(__n_00);
        apcStack_a08[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar8,pvVar11,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_a08[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_a08[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_a08[0] = (code *)0x13dc4f;
      pcVar24 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_a08[0] = (code *)0x13dc5c;
      pcVar13 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar6 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar9 = 0;
        do {
          if (uVar4 == (uint)uVar9) break;
          if (pcVar25[uVar9] != __buf[uVar9]) goto LAB_0013dd28;
          uVar9 = uVar9 + 1;
        } while (uVar3 != (uint)uVar9);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar9 = (ulong)(uVar3 - 1);
      pcVar19 = pcVar24;
      while( true ) {
        apcStack_a08[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9);
        apcStack_a08[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar24 = (char *)(ulong)uVar3;
        pcVar22 = "failure.expected.bson";
        pcVar21 = (char *)0x42;
        apcStack_a08[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_984 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar24 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar22 = (char *)(ulong)uVar3;
        apcStack_a08[0] = (code *)0x13dd01;
        pcVar21 = pcVar25;
        pcVar14 = (char *)write(uVar3,pcVar25,(size_t)__n_00);
        if (pcVar14 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_a08[0] = (code *)0x13dd17;
        pcVar21 = __buf;
        pcVar22 = pcVar24;
        pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar14 != __n) goto LAB_0013dd4d;
        uVar9 = (ulong)uVar4;
        apcStack_a08[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar13 = extraout_RAX_07;
LAB_0013dd28:
        uVar9 = uVar9 & 0xffffffff;
        pcVar19 = pcVar24;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_a08[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_a08[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_a08[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_a08[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_a08[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_7040 = auStack_7030;
  if (extraout_AL != '\0') {
    uStack_6ff0 = uVar6;
  }
  pcStack_7088 = (code *)0x13ddd5;
  pcStack_7028 = pcVar21;
  pcStack_7018 = pcVar19;
  pcStack_7010 = pcVar13;
  uStack_7008 = uVar7;
  pcStack_a28 = __n;
  pcStack_a20 = pcVar25;
  pcStack_a18 = __buf;
  pcStack_a10 = __n_00;
  apcStack_a08[0] = (code *)&pcStack_840;
  bcon_extract_ctx_init(aDStack_6f80);
  puStack_7048 = auStack_9f8;
  uStack_7050 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_7028) {
    uVar3 = (uint)pcStack_7028;
    do {
      pcStack_7088 = (code *)0x13de41;
      __s = aDStack_6f80;
      pcVar25 = pcVar22;
      cVar1 = bcon_extract_ctx_va(pcVar22,aDStack_6f80,&uStack_7050);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        pcStack_7088 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_70b0 = (code *)0x13de73;
        __name = __s;
        pcStack_70a8 = pcVar22;
        uStack_70a0 = (ulong)uVar3;
        pcStack_7098 = pcVar24;
        pDStack_7090 = aDStack_6f80;
        pcStack_7088 = (code *)&uStack_7050;
        pdVar15 = (dirent *)strlen(pcVar25);
        pcStack_70b0 = (code *)0x13de7e;
        paths = __s;
        sVar16 = strlen((char *)__s);
        if ((int)sVar16 + (int)pdVar15 < 499) {
          pcStack_70b0 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_70b0 = (code *)0x13dea8;
          strncat(__dest,pcVar25,(long)(int)pdVar15);
          pcStack_70b0 = (code *)0x13deb0;
          sVar17 = strlen(__dest);
          (__dest + sVar17)[0] = '/';
          (__dest + sVar17)[1] = '\0';
          pcStack_70b0 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar16);
          pcVar25 = __dest;
          do {
            if (*pcVar25 == '\\') {
              *pcVar25 = '/';
            }
            else if (*pcVar25 == '\0') {
              return;
            }
            pcVar25 = pcVar25 + 1;
          } while( true );
        }
        pcStack_70b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar9 = (ulong)extraout_EDX;
        pDStack_7368 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_70d0 = sVar16;
        pdStack_70c8 = pdVar15;
        pDStack_70c0 = __s;
        pcStack_70b8 = pcVar25;
        pcStack_70b0 = (code *)apcStack_a08;
        __dirp = opendir((char *)__name);
        pDStack_7370 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_7368 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar15 = readdir(__dirp);
        do {
          if (pdVar15 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_7368 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar9;
          if (iVar2 <= paths_index) {
            pDStack_7368 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_7370 = __dirp;
LAB_0013e018:
            pDStack_7368 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_7388 = uVar9;
            pDStack_7380 = paths;
            pdStack_7378 = pdVar15;
            pDStack_7368 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar16 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar16) {
                pvVar8 = (void *)bson_malloc0(sVar16);
                sVar17 = fread(pvVar8,1,sVar16,__stream);
                if (sVar17 != sVar16) {
                  abort();
                }
                fclose(__stream);
                if (pvVar8 != (void *)0x0) {
                  lVar18 = bson_new_from_json(pvVar8,sVar16,auStack_7588);
                  if (lVar18 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7580);
                    abort();
                  }
                  bson_free(pvVar8);
                }
              }
            }
            return;
          }
          while ((pdVar15->d_name[0] == '.' &&
                 (((pdVar15->d_name[1] == '.' && (pdVar15->d_name[2] == '\0')) ||
                  (pdVar15->d_name[1] == '\0'))))) {
            pDStack_7368 = (DIR *)0x13df58;
            pdVar15 = readdir(__dirp);
            if (pdVar15 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar25 = pdVar15->d_name;
          pDStack_7368 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar25,acStack_72d0);
          pDStack_7368 = (DIR *)0x13df87;
          iVar5 = stat(pcVar25,&sStack_7360);
          if ((iVar5 == 0) && ((sStack_7360.st_mode & 0xf000) == 0x4000)) {
            pDStack_7368 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_72d0,paths_index,iVar2);
            uVar9 = (ulong)uVar3;
          }
          else {
            pDStack_7368 = (DIR *)0x13dfc4;
            pcVar24 = strstr(pcVar25,".json");
            if (pcVar24 != (char *)0x0) {
              uVar9 = (ulong)(paths_index + 1);
              pDStack_7368 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar25,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_7368 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar15 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_regex (void)
{
   const char *regex;
   const char *flags;

   bson_t *bcon = BCON_NEW ("foo", BCON_REGEX ("^foo|bar$", "i"));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_REGEX (regex, flags)));

   BSON_ASSERT (strcmp (regex, "^foo|bar$") == 0);
   BSON_ASSERT (strcmp (flags, "i") == 0);

   bson_destroy (bcon);
}